

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,endpoint *ep,span<const_char> buf)

{
  session_logger *psVar1;
  udp_tracker_connection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar2;
  uint ret;
  int iVar3;
  uint uVar4;
  iterator iVar5;
  long lVar6;
  endpoint *ep_00;
  endpoint *ep_01;
  uint ret_1;
  uint uVar7;
  uint32_t transaction;
  uint local_4c;
  string local_48;
  
  if (buf.m_len < 8) {
    iVar3 = (**this->m_ses->_vptr_session_logger)();
    if ((char)iVar3 != '\0') {
      psVar1 = this->m_ses;
      print_endpoint_abi_cxx11_(&local_48,(aux *)ep,ep_00);
      (*psVar1->_vptr_session_logger[1])
                (psVar1,"incoming packet from %s, not a UDP tracker message (%d Bytes)",
                 local_48._M_dataplus._M_p,buf.m_len & 0xffffffff);
LAB_00370d37:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    uVar4 = 0;
    lVar6 = 0;
    do {
      uVar4 = uVar4 << 8 | (uint)(byte)buf.m_ptr[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    uVar7 = 0;
    if (3 < uVar4) goto LAB_00370e16;
    lVar6 = 4;
    do {
      uVar7 = uVar7 << 8 | (uint)(byte)buf.m_ptr[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    local_4c = uVar7;
    iVar5 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_4c);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      this_00 = *(udp_tracker_connection **)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                        ._M_cur + 0x10);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                        ._M_cur + 0x18);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      bVar2 = udp_tracker_connection::on_receive(this_00,ep,buf);
      uVar7 = (uint)bVar2;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      goto LAB_00370e16;
    }
    iVar3 = (**this->m_ses->_vptr_session_logger)();
    if ((char)iVar3 != '\0') {
      psVar1 = this->m_ses;
      print_endpoint_abi_cxx11_(&local_48,(aux *)ep,ep_01);
      (*psVar1->_vptr_session_logger[1])
                (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
                 local_48._M_dataplus._M_p,(ulong)local_4c);
      goto LAB_00370d37;
    }
  }
  uVar7 = 0;
LAB_00370e16:
  return SUB41(uVar7,0);
}

Assistant:

bool tracker_manager::incoming_packet(udp::endpoint const& ep
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 8)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming packet from %s, not a UDP tracker message "
					"(%d Bytes)", print_endpoint(ep).c_str(), int(buf.size()));
			}
#endif
			return false;
		}

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming UDP tracker packet from %s has invalid "
					"transaction ID (%x)", print_endpoint(ep).c_str()
					, transaction);
			}
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive(ep, buf);
	}